

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> __thiscall
deqp::egl::GLES2ThreadTest::EGLResourceManager::popImage(EGLResourceManager *this,int index)

{
  reference other;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
  *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> SVar1;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>_>
  local_38;
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_1d;
  int local_1c;
  long lStack_18;
  int index_local;
  EGLResourceManager *this_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image;
  
  lStack_18 = CONCAT44(in_register_00000034,index);
  local_1d = 0;
  this_00 = (vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
             *)(lStack_18 + 0x30);
  local_1c = in_EDX;
  this_local = this;
  other = std::
          vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
          ::operator[](this_00,(long)in_EDX);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)this,other);
  local_38._M_current =
       (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)
       std::
       vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
       ::begin(this_00);
  local_30 = __gnu_cxx::
             __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_*,_std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>_>
             ::operator+(&local_38,(long)local_1c);
  __gnu_cxx::
  __normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>>>>
  ::__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>*>
            ((__normal_iterator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>const*,std::vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>>>>
              *)&local_28,&local_30);
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>_>_>
  ::erase(this_00,local_28);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (EGLImage *)this;
  return SVar1;
}

Assistant:

SharedPtr<EGLImage> EGLResourceManager::popImage (int index)
{
	SharedPtr<EGLImage> image = m_images[index];
	m_images.erase(m_images.begin() + index);
	return image;
}